

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes(Bac_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *vArray;
  Vec_Ptr_t *Entry;
  int iVar3;
  int i;
  long lVar4;
  int Counter;
  int iVar5;
  
  iVar3 = (p->vType).nSize;
  iVar5 = 0;
  iVar2 = iVar3;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    uVar1 = Abc_Lit2Var((int)(p->vType).pArray[lVar4]);
    iVar5 = iVar5 + (uint)(uVar1 < 5);
    iVar2 = (p->vType).nSize;
  }
  vArray = Vec_PtrAllocExact(iVar3 - iVar5);
  for (iVar3 = 0; iVar3 < (p->vType).nSize; iVar3 = iVar3 + 1) {
    iVar2 = Bac_ObjIsBox(p,iVar3);
    if (iVar2 != 0) {
      Entry = Bac_NtkTransformToPtrBox(p,iVar3);
      Vec_PtrPush(vArray,Entry);
    }
  }
  Ptr_CheckArray(vArray);
  return vArray;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBoxes( Bac_Ntk_t * p )
{
    int iBox;
    Vec_Ptr_t * vBoxes = Vec_PtrAllocExact( Bac_NtkBoxNum(p) );
    Bac_NtkForEachBox( p, iBox )
        Vec_PtrPush( vBoxes, Bac_NtkTransformToPtrBox(p, iBox) );
    assert( Ptr_CheckArray(vBoxes) );
    return vBoxes;
}